

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::GetParameterTolerance
          (ON_NurbsSurface *this,int dir,double t,double *tminus,double *tplus)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  int cv_count;
  int order;
  double *knot;
  double t1;
  double t0;
  ON_Interval d;
  bool rc;
  double *tplus_local;
  double *tminus_local;
  double t_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  d.m_t[1]._7_1_ = 0;
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
            (this,(ulong)(uint)dir);
  t1 = ON_Interval::Min((ON_Interval *)&t0);
  knot = (double *)ON_Interval::Max((ON_Interval *)&t0);
  if (t1 <= (double)knot) {
    pdVar3 = Knot(this,dir);
    iVar1 = Order(this,dir);
    iVar2 = CVCount(this,dir);
    if (pdVar3[iVar1 + -1] <= t) {
      if (pdVar3[iVar2 + -2] <= t && t != pdVar3[iVar2 + -2]) {
        t1 = pdVar3[iVar2 + -2];
      }
    }
    else {
      knot = (double *)pdVar3[iVar1 + -1];
    }
    d.m_t[1]._7_1_ = ON_GetParameterTolerance(t1,(double)knot,t,tminus,tplus);
  }
  return (bool)(d.m_t[1]._7_1_ & 1);
}

Assistant:

bool ON_NurbsSurface::GetParameterTolerance( // returns tminus < tplus: parameters tminus <= s <= tplus
       int dir,
       double t,       // t = parameter in domain
       double* tminus, // tminus
       double* tplus   // tplus
       ) const
{
  bool rc = false;
  ON_Interval d = Domain(dir);
  double t0 = d.Min();
  double t1 = d.Max();
  if ( t0 <= t1 ) {
    const double* knot = Knot(dir);
    const int order = Order(dir);
    const int cv_count = CVCount(dir);
    if ( t < knot[order-1] )
      t1 = knot[order-1];
    else if ( t > knot[cv_count-2] )
      t0 = knot[cv_count-2];
    rc = ON_GetParameterTolerance( t0, t1, t, tminus, tplus );
  }
  return rc;
}